

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O3

void test_read_format_mtree_nomagic_v2_form(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  FILE *__s;
  size_t v2;
  char *pcVar4;
  la_int64_t lVar5;
  la_ssize_t v2_00;
  archive_entry *ae;
  char buff [16];
  char reffile [38];
  archive_entry *local_70;
  undefined1 local_68 [16];
  char local_58 [40];
  
  builtin_strncpy(local_58,"test_read_format_mtree_nomagic2.mtree",0x26);
  extract_reference_file(local_58);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'ʀ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʂ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʄ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_set_options((archive *)a,"mtree:checkfs");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʆ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_options(a, \"mtree:checkfs\")",a);
  wVar2 = archive_read_open_filename(a,local_58,0xb);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʈ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, reffile, 11)"
                      ,a);
  __s = fopen("file","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                   ,L'ʎ',(uint)(__s != (FILE *)0x0),"f != NULL",(void *)0x0);
  v2 = fwrite("hi\n",1,3,__s);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʏ',3,"3",v2,"fwrite(\"hi\\n\", 1, 3, f)",(void *)0x0);
  fclose(__s);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʑ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʒ',(long)iVar1,"archive_format(a)",0x80000,"ARCHIVE_FORMAT_MTREE",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ʓ',pcVar4,"archive_entry_pathname(ae)","./file","\"./file\"",(void *)0x0,L'\0');
  lVar5 = archive_entry_uid(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʔ',lVar5,"archive_entry_uid(ae)",0x12,"18",(void *)0x0);
  mVar3 = archive_entry_filetype(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʕ',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʖ',(ulong)mVar3,"archive_entry_mode(ae)",0x8053,"AE_IFREG | 0123",
                      (void *)0x0);
  lVar5 = archive_entry_size(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʗ',lVar5,"archive_entry_size(ae)",3,"3",(void *)0x0);
  v2_00 = archive_read_data((archive *)a,local_68,3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʘ',3,"3",v2_00,"archive_read_data(a, buff, 3)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʙ',local_68,"buff","hi\n","\"hi\\n\"",3,"3",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʛ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ʜ',pcVar4,"archive_entry_pathname(ae)","./dir","\"./dir\"",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʝ',(ulong)mVar3,"archive_entry_mode(ae)",0x41ed,"AE_IFDIR | 0755",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʟ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ʠ',pcVar4,"archive_entry_pathname(ae)","./dir/file with space",
             "\"./dir/file with space\"",(void *)0x0,L'\0');
  lVar5 = archive_entry_uid(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʡ',lVar5,"archive_entry_uid(ae)",0x12,"18",(void *)0x0);
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʢ',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʤ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ʥ',pcVar4,"archive_entry_pathname(ae)","./file with space","\"./file with space\"",
             (void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʦ',(ulong)mVar3,"archive_entry_mode(ae)",0x81a4,"AE_IFREG | 0644",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʨ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ʩ',pcVar4,"archive_entry_pathname(ae)","./dir2","\"./dir2\"",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʪ',(ulong)mVar3,"archive_entry_mode(ae)",0x41ed,"AE_IFDIR | 0755",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʬ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
             ,L'ʭ',pcVar4,"archive_entry_pathname(ae)","./dir2/dir3a","\"./dir2/dir3a\"",
             (void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʮ',(ulong)mVar3,"archive_entry_mode(ae)",0x41ed,"AE_IFDIR | 0755",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʰ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʱ',6,"6",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʲ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_mtree.c"
                      ,L'ʳ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_nomagic_v2_form)
{
	const char reffile[] = "test_read_format_mtree_nomagic2.mtree";
	char buff[16];
	struct archive_entry *ae;
	struct archive *a;
	FILE *f;

	extract_reference_file(reffile);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile, 11));

	/*
	 * Read "file", whose data is available on disk.
	 */
	f = fopen("file", "wb");
	assert(f != NULL);
	assertEqualInt(3, fwrite("hi\n", 1, 3, f));
	fclose(f);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_MTREE);
	assertEqualString(archive_entry_pathname(ae), "./file");
	assertEqualInt(archive_entry_uid(ae), 18);
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0123);
	assertEqualInt(archive_entry_size(ae), 3);
	assertEqualInt(3, archive_read_data(a, buff, 3));
	assertEqualMem(buff, "hi\n", 3);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir/file with space");
	assertEqualInt(archive_entry_uid(ae), 18);
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./file with space");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir2");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "./dir2/dir3a");
	assertEqualInt(archive_entry_mode(ae), AE_IFDIR | 0755);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(6, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}